

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataGroup.cpp
# Opt level: O0

bool __thiscall DL::DataGroup::isAllOfType(DataGroup *this,DataType type)

{
  bool bVar1;
  element_type *peVar2;
  bool local_2a;
  DataType type_local;
  DataGroup *this_local;
  
  peVar2 = std::__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = std::vector<DL::Data,_std::allocator<DL::Data>_>::empty(&peVar2->AnonymousData);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    bVar1 = std::vector<DL::Data,_std::allocator<DL::Data>_>::empty(&peVar2->NamedData);
    if (bVar1) {
      return false;
    }
  }
  peVar2 = std::__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = std::vector<DL::Data,_std::allocator<DL::Data>_>::empty(&peVar2->AnonymousData);
  if ((!bVar1) && (bVar1 = isAllAnonymousOfType(this,type), !bVar1)) {
    return false;
  }
  peVar2 = std::__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<DL::DataInternal,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar1 = std::vector<DL::Data,_std::allocator<DL::Data>_>::empty(&peVar2->NamedData);
  local_2a = true;
  if (!bVar1) {
    local_2a = isAllNamedOfType(this,type);
  }
  return local_2a;
}

Assistant:

bool DataGroup::isAllOfType(DL::DataType type) const
{
	if (mShared->AnonymousData.empty() && mShared->NamedData.empty())
		return false;

	return (mShared->AnonymousData.empty() || isAllAnonymousOfType(type))
		   && (mShared->NamedData.empty() || isAllNamedOfType(type));
}